

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O2

bool anon_unknown.dwarf_412f5::EndsWith(string *input,string *needle)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (input->_M_string_length < needle->_M_string_length) {
    _Var1 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)input);
    _Var1 = std::operator==(&local_30,needle);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return _Var1;
}

Assistant:

bool EndsWith(const string& input, const string& needle) {
  return (input.size() >= needle.size() &&
          input.substr(input.size() - needle.size()) == needle);
}